

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::StandardCaseItemSyntax::StandardCaseItemSyntax
          (StandardCaseItemSyntax *this,
          SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *expressions,Token colon,
          SyntaxNode *clause)

{
  bool bVar1;
  SyntaxNode *pSVar2;
  size_t in_RCX;
  SyntaxNode *in_RDX;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *in_RDI;
  SyntaxNode *in_R8;
  ExpressionSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *in_stack_ffffffffffffffa0;
  SyntaxNode *local_30;
  SyntaxNode *local_28;
  SyntaxNode *local_10;
  size_t local_8;
  
  local_28 = in_R8;
  local_10 = in_RDX;
  local_8 = in_RCX;
  CaseItemSyntax::CaseItemSyntax
            ((CaseItemSyntax *)in_stack_ffffffffffffffa0,(SyntaxKind)((ulong)in_RDI >> 0x20));
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::SeparatedSyntaxList
            (in_stack_ffffffffffffffa0,in_RDI);
  in_RDI[1].super_SyntaxListBase.super_SyntaxNode.previewNode = local_10;
  in_RDI[1].super_SyntaxListBase.childCount = local_8;
  local_30 = local_28;
  not_null<slang::syntax::SyntaxNode_*>::not_null<slang::syntax::SyntaxNode_*>
            ((not_null<slang::syntax::SyntaxNode_*> *)&in_RDI[1].elements,&local_30);
  (in_RDI->elements)._M_ptr = (pointer)in_RDI;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0x4320ab);
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::end(in_stack_ffffffffffffffa0);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>_>
                      ((self_type *)in_stack_ffffffffffffffa0,
                       (iterator_base<slang::syntax::ExpressionSyntax_*> *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffa0 =
         (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)
         iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
         ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
                      *)0x4320ea);
    *(SeparatedSyntaxList<slang::syntax::ExpressionSyntax> **)
     &(in_stack_ffffffffffffffa0->super_SyntaxListBase).super_SyntaxNode = in_RDI;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
                *)in_stack_ffffffffffffffa0);
  }
  pSVar2 = not_null<slang::syntax::SyntaxNode_*>::operator->
                     ((not_null<slang::syntax::SyntaxNode_*> *)0x432115);
  pSVar2->parent = (SyntaxNode *)in_RDI;
  return;
}

Assistant:

StandardCaseItemSyntax(const SeparatedSyntaxList<ExpressionSyntax>& expressions, Token colon, SyntaxNode& clause) :
        CaseItemSyntax(SyntaxKind::StandardCaseItem), expressions(expressions), colon(colon), clause(&clause) {
        this->expressions.parent = this;
        for (auto child : this->expressions)
            child->parent = this;
        this->clause->parent = this;
    }